

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O1

MPP_RET hal_h265e_v580_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  MppPacket pvVar5;
  undefined8 *param_00;
  MppBuffer buffer;
  long lVar6;
  uint *puVar7;
  bool bVar8;
  undefined4 uVar9;
  int iVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  uint offset;
  ulong uVar16;
  int iVar17;
  uint length;
  EncOutParam param;
  MPP_RET local_ac;
  uint local_a8;
  HalEncTask *local_48;
  void *local_40;
  uint local_34;
  
  uVar14 = *(uint *)(*(long *)((long)hal + 200) + 0xe9c);
  lVar3 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x70);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xc85);
  }
  if ((task->flags).err == 0) {
    if (uVar14 == 0 || ((ulong)task->rc_task->frm & 4) != 0) {
      puVar4 = *(uint **)(lVar3 + 0x38);
      local_a8 = *(uint *)(*(long *)(lVar3 + 0x18) + 400);
      pvVar5 = task->packet;
      sVar11 = mpp_packet_get_length(pvVar5);
      if (*(int *)((long)hal + 0xec) == 0) {
        local_ac = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
      }
      else if (*(int *)((long)hal + 0xe8) == 0) {
        local_ac = MPP_OK;
      }
      else {
        uVar14 = 0;
        do {
          local_ac = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
          uVar14 = uVar14 + 1;
        } while (uVar14 < *(uint *)((long)hal + 0xe8));
      }
      if (*(int *)((long)hal + 0xe8) != 0) {
        local_a8 = local_a8 & 0x3f;
        uVar16 = 0;
        do {
          puVar7 = *(uint **)(lVar3 + 0x38 + uVar16 * 8);
          uVar14 = *puVar7;
          uVar2 = puVar7[1];
          if (((uVar14 & 2) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
            _mpp_log_l(4,"hal_h265e_v580","RKV_ENC_INT_LINKTABLE_FINISH",(char *)0x0);
          }
          if (((uVar14 & 1) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
            _mpp_log_l(4,"hal_h265e_v580","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
          }
          if (((uVar14 & 8) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
            _mpp_log_l(4,"hal_h265e_v580","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
          }
          if (((uVar14 & 4) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
            _mpp_log_l(4,"hal_h265e_v580","RKV_ENC_INT_SAFE_CLEAR_FINISH",(char *)0x0);
          }
          if ((uVar14 & 0x10) != 0) {
            _mpp_log_l(2,"hal_h265e_v580","RKV_ENC_INT_BIT_STREAM_OVERFLOW",
                       "hal_h265e_vepu580_status_check");
          }
          local_ac = MPP_OK;
          if ((uVar14 & 0x20) != 0) {
            _mpp_log_l(2,"hal_h265e_v580","RKV_ENC_INT_BUS_WRITE_FULL",
                       "hal_h265e_vepu580_status_check");
            local_ac = MPP_NOK;
          }
          if ((uVar14 & 0x40) != 0) {
            _mpp_log_l(2,"hal_h265e_v580","RKV_ENC_INT_BUS_WRITE_ERROR",
                       "hal_h265e_vepu580_status_check");
            local_ac = MPP_NOK;
          }
          if ((char)uVar14 < '\0') {
            _mpp_log_l(2,"hal_h265e_v580","RKV_ENC_INT_BUS_READ_ERROR",
                       "hal_h265e_vepu580_status_check");
            local_ac = MPP_NOK;
          }
          if ((uVar14 >> 8 & 1) != 0) {
            _mpp_log_l(2,"hal_h265e_v580","RKV_ENC_INT_TIMEOUT_ERROR",
                       "hal_h265e_vepu580_status_check");
            local_ac = MPP_NOK;
          }
          if (local_ac == MPP_OK) {
            mpp_packet_add_segment_info(pvVar5,local_a8,(int)sVar11,uVar2);
            sVar11 = (size_t)((int)sVar11 + uVar2);
            bVar8 = true;
            if (((uVar14 & 0xc0) != 0) && (*(int *)((long)hal + 0xf0) != 0)) {
              dump_files((H265eV580HalContext *)hal,task);
              goto LAB_00258d2d;
            }
          }
          else {
LAB_00258d2d:
            bVar8 = false;
          }
        } while ((bVar8) && (uVar16 = uVar16 + 1, uVar16 < *(uint *)((long)hal + 0xe8)));
      }
      if (local_ac != MPP_OK) {
        _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d status %d \n","hal_h265e_v580_wait",
                   (ulong)(uint)local_ac,(ulong)*puVar4);
      }
    }
    else {
      pvVar5 = task->packet;
      sVar11 = mpp_packet_get_length(pvVar5);
      pvVar12 = mpp_packet_get_pos(pvVar5);
      uVar2 = *(uint *)(*(long *)(lVar3 + 0x18) + 400);
      param_00 = *(undefined8 **)((long)hal + 0x140);
      local_48 = task;
      local_40 = mpp_packet_get_data(task->packet);
      offset = 0;
      uVar16 = sVar11 & 0xffffffff;
      iVar17 = 0;
      uVar1 = 0;
      do {
        while( true ) {
          *param_00 = 0;
          uVar9 = 1;
          if ((uVar14 & 1) == 0) {
            uVar9 = *(undefined4 *)((long)hal + 0x88);
          }
          *(undefined4 *)(param_00 + 1) = uVar9;
          *(undefined4 *)((long)param_00 + 0xc) = 0;
          local_ac = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,param_00);
          if (0 < *(int *)((long)param_00 + 0xc)) {
            lVar15 = 0;
            do {
              uVar1 = *(uint *)((long)param_00 + lVar15 * 4 + 0x10);
              length = uVar1 & 0x7fffffff;
              local_34 = length;
              if (iVar17 == 0) {
                mpp_buffer_sync_partial_begin_f
                          (task->output,1,(RK_U32)sVar11,length,"hal_h265e_v580_wait");
              }
              else {
                buffer = *(MppBuffer *)(lVar3 + 0x1b0 + (ulong)(iVar17 - 1) * 8);
                pvVar13 = mpp_buffer_get_ptr_with_caller(buffer,"hal_h265e_v580_wait");
                mpp_buffer_sync_partial_begin_f(buffer,1,offset,length,"hal_h265e_v580_wait");
                memcpy((void *)(uVar16 + (long)pvVar12),(void *)((ulong)offset + (long)pvVar13),
                       (ulong)length);
                offset = offset + length;
              }
              lVar6 = *(long *)((long)hal + 0x148);
              *(undefined4 *)(lVar6 + 0x10) = 0x202;
              iVar10 = iVar17;
              if ((int)uVar1 < 0) {
                iVar10 = iVar17 + 1;
                offset = 0;
                if ((*(int *)((long)hal + 0xec) != 0) && (*(uint *)((long)hal + 0xe8) < iVar17 + 2U)
                   ) {
                  *(undefined4 *)(lVar6 + 0x10) = 0x201;
                }
              }
              iVar17 = iVar10;
              mpp_packet_add_segment_info(pvVar5,uVar2 & 0x3f,(int)uVar16,length);
              if ((uVar14 & 1) != 0) {
                mpp_callback_f("hal_h265e_v580_wait",*(MppCbCtx **)((long)hal + 0x148),&local_48);
              }
              uVar16 = (ulong)((int)uVar16 + length);
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)param_00 + 0xc));
            uVar1 = uVar1 >> 0x1f;
          }
          if (*(int *)((long)hal + 0xec) == 0) break;
          if (*(uint *)((long)hal + 0xe8) < iVar17 + 1U) goto LAB_00258d7d;
        }
      } while (uVar1 == 0);
    }
LAB_00258d7d:
    if (((byte)hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xcff);
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return early","hal_h265e_v580_wait");
    local_ac = MPP_NOK;
  }
  return local_ac;
}

Assistant:

MPP_RET hal_h265e_v580_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_U32 split_out = ctx->cfg->split.split_out;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu580H265eFrmCfg *frm = ctx->frms[task_idx];

    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (enc_task->rc_task->frm.save_pass1)
        split_out = 0;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len = 0;
        RK_U32 slice_last = 0;
        RK_U32 finish_cnt = 0;
        RK_U32 tile1_offset = 0;
        MppPacket pkt = enc_task->packet;
        RK_U32 offset = mpp_packet_get_length(pkt);
        RK_U32 seg_offset = offset;
        void* ptr = mpp_packet_get_pos(pkt);
        H265eV580RegSet *regs = frm->regs_set[0];
        hevc_vepu580_base *reg_base = &regs->reg_base;
        RK_U32 type = reg_base->reg0236_synt_nal.nal_unit_type;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs);

        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            RK_S32 i = 0;
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = split_out & MPP_ENC_SPLIT_OUT_LOWDELAY ? 1 : ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);

            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;
                param.length = slice_len;

                if (finish_cnt > 0) {
                    MppBuffer buf = frm->hw_tile_stream[finish_cnt - 1];
                    void *tile1_ptr  = mpp_buffer_get_ptr(buf);

                    mpp_buffer_sync_ro_partial_begin(buf, tile1_offset, slice_len);
                    memcpy(ptr + seg_offset, tile1_ptr + tile1_offset, slice_len);
                    tile1_offset += slice_len;
                } else {
                    MppBuffer buf = enc_task->output;

                    mpp_buffer_sync_ro_partial_begin(buf, offset, slice_len);
                }

                ctx->output_cb->cmd = ENC_OUTPUT_SLICE;
                if (slice_last) {
                    finish_cnt++;
                    tile1_offset = 0;
                    if (ctx->tile_parall_en) {
                        if (finish_cnt + 1 > ctx->tile_num) {
                            ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                        }
                    }
                }

                mpp_packet_add_segment_info(pkt, type, seg_offset, slice_len);

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY)
                    mpp_callback(ctx->output_cb, &param);

                seg_offset += slice_len;
            }

            if (ctx->tile_parall_en) {
                if (finish_cnt + 1 > ctx->tile_num) {
                    break;
                }
            } else if (slice_last) {
                break;
            }
        } while (1);
    } else {
        H265eV580StatusElem *elem = frm->regs_ret[0];
        H265eV580RegSet *regs = frm->regs_set[0];
        hevc_vepu580_base *reg_base = &regs->reg_base;
        RK_U32 type = reg_base->reg0236_synt_nal.nal_unit_type;
        MppPacket pkt = enc_task->packet;
        RK_U32 offset = mpp_packet_get_length(pkt);
        RK_U32 i = 0;

        if (ctx->tile_parall_en) {
            for (i = 0; i < ctx->tile_num; i ++)
                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        } else {
            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        }

        for (i = 0; i < ctx->tile_num; i++) {
            H265eV580StatusElem *elem_ret = frm->regs_ret[i];
            RK_U32 hw_status = elem_ret->hw_status;
            RK_U32 tile_size = elem_ret->st.bs_lgth_l32;

            ret = hal_h265e_vepu580_status_check(hw_status);
            if (ret)
                break;
            mpp_packet_add_segment_info(pkt, type, offset, tile_size);
            offset += tile_size;

            if (ctx->tile_dump_err &&
                (hw_status & (RKV_ENC_INT_BUS_WRITE_ERROR | RKV_ENC_INT_BUS_READ_ERROR))) {
                dump_files(ctx, enc_task);
                break;
            }
        }

        if (ret)
            mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);
    }

    hal_h265e_leave();

    return ret;
}